

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::converter::DataPiece::DecodeBase64
          (DataPiece *this,StringPiece src,string *dest)

{
  bool bVar1;
  stringpiece_ssize_type sVar2;
  string *dest_00;
  char *pcVar3;
  protobuf *this_00;
  undefined1 auVar4 [8];
  StringPiece src_00;
  StringPiece src_01;
  StringPiece SVar5;
  StringPiece x;
  StringPiece local_c8;
  string local_b8;
  string local_98;
  StringPiece local_78;
  undefined1 local_60 [8];
  string encoded;
  StringPiece src_local;
  
  pcVar3 = (char *)src.length_;
  this_00 = (protobuf *)src.ptr_;
  SVar5.length_ = (stringpiece_ssize_type)dest;
  SVar5.ptr_ = pcVar3;
  dest_00 = dest;
  encoded.field_2._8_8_ = this_00;
  src_local.ptr_ = pcVar3;
  bVar1 = WebSafeBase64Unescape(this_00,SVar5,dest);
  if (bVar1) {
    if (this->use_strict_base64_decoding_ != true) {
      return true;
    }
    local_60 = (undefined1  [8])&encoded._M_string_length;
    encoded._M_dataplus._M_p = (pointer)0x0;
    encoded._M_string_length._0_1_ = 0;
    StringPiece::StringPiece<std::allocator<char>>(&local_c8,dest);
    src_00.length_ = (stringpiece_ssize_type)local_60;
    src_00.ptr_ = (char *)local_c8.length_;
    WebSafeBase64Escape((protobuf *)local_c8.ptr_,src_00,dest_00);
    local_78.ptr_ = (char *)encoded.field_2._8_8_;
    local_78.length_ = (stringpiece_ssize_type)src_local.ptr_;
    StringPiece::ToString_abi_cxx11_(&local_b8,(StringPiece *)((long)&encoded.field_2 + 8));
    std::__cxx11::string::string
              ((string *)&local_98,"=",(allocator *)((long)&src_local.length_ + 7));
    bVar1 = HasSuffixString(&local_b8,&local_98);
    pcVar3 = src_local.ptr_;
    if (bVar1) {
      sVar2 = StringPiece::find_last_not_of
                        ((StringPiece *)((long)&encoded.field_2 + 8),'=',0xffffffffffffffff);
      pcVar3 = (char *)(sVar2 + 1);
    }
    SVar5 = StringPiece::substr(&local_78,0,(size_type)pcVar3);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    auVar4 = local_60;
    sVar2 = StringPiece::CheckedSsizeTFromSizeT((size_t)encoded._M_dataplus._M_p);
  }
  else {
    src_01.length_ = (stringpiece_ssize_type)dest;
    src_01.ptr_ = pcVar3;
    bVar1 = Base64Unescape(this_00,src_01,dest_00);
    if (!bVar1) {
      return false;
    }
    if (this->use_strict_base64_decoding_ != true) {
      return true;
    }
    local_60 = (undefined1  [8])&encoded._M_string_length;
    encoded._M_dataplus._M_p = (pointer)0x0;
    encoded._M_string_length._0_1_ = 0;
    Base64Escape((uchar *)(dest->_M_dataplus)._M_p,(int)dest->_M_string_length,(string *)local_60,
                 false);
    local_78.ptr_ = (char *)encoded.field_2._8_8_;
    local_78.length_ = (stringpiece_ssize_type)src_local.ptr_;
    StringPiece::ToString_abi_cxx11_(&local_b8,(StringPiece *)((long)&encoded.field_2 + 8));
    std::__cxx11::string::string
              ((string *)&local_98,"=",(allocator *)((long)&src_local.length_ + 7));
    bVar1 = HasSuffixString(&local_b8,&local_98);
    pcVar3 = src_local.ptr_;
    if (bVar1) {
      sVar2 = StringPiece::find_last_not_of
                        ((StringPiece *)((long)&encoded.field_2 + 8),'=',0xffffffffffffffff);
      pcVar3 = (char *)(sVar2 + 1);
    }
    SVar5 = StringPiece::substr(&local_78,0,(size_type)pcVar3);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    auVar4 = local_60;
    sVar2 = StringPiece::CheckedSsizeTFromSizeT((size_t)encoded._M_dataplus._M_p);
  }
  x.length_ = sVar2;
  x.ptr_ = (char *)auVar4;
  bVar1 = operator==(x,SVar5);
  std::__cxx11::string::~string((string *)local_60);
  return bVar1;
}

Assistant:

bool DataPiece::DecodeBase64(StringPiece src, std::string* dest) const {
  // Try web-safe decode first, if it fails, try the non-web-safe decode.
  if (WebSafeBase64Unescape(src, dest)) {
    if (use_strict_base64_decoding_) {
      // In strict mode, check if the escaped version gives us the same value as
      // unescaped.
      std::string encoded;
      // WebSafeBase64Escape does no padding by default.
      WebSafeBase64Escape(*dest, &encoded);
      // Remove trailing padding '=' characters before comparison.
      StringPiece src_no_padding = StringPiece(src).substr(
          0, HasSuffixString(src, "=") ? src.find_last_not_of('=') + 1
                                      : src.length());
      return encoded == src_no_padding;
    }
    return true;
  }

  if (Base64Unescape(src, dest)) {
    if (use_strict_base64_decoding_) {
      std::string encoded;
      Base64Escape(reinterpret_cast<const unsigned char*>(dest->data()),
                         dest->length(), &encoded, false);
      StringPiece src_no_padding = StringPiece(src).substr(
          0, HasSuffixString(src, "=") ? src.find_last_not_of('=') + 1
                                      : src.length());
      return encoded == src_no_padding;
    }
    return true;
  }

  return false;
}